

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O0

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::rank
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,symbol x,
          ulint i)

{
  ulint in_RDX;
  long in_RDI;
  vector<bool,_std::allocator<bool>_> code;
  size_type in_stack_ffffffffffffff88;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *in_stack_ffffffffffffff90;
  ulint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd0;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  if (*(long *)(in_RDI + 0x78) == 0) {
    local_8 = 0;
  }
  else {
    local_8 = in_RDX;
    if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::at(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)
                 code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_end_of_storage,
                 (vector<bool,_std::allocator<bool>_> *)
                 code.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_finish.super__Bit_iterator_base._8_8_);
      local_8 = rank(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                     in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x1591a8);
    }
  }
  return local_8;
}

Assistant:

ulint rank(symbol x, ulint i){

		if(n==0)
			return 0;

	#ifdef DEBUG
		if(i>current_size){

			cout << "ERROR (DynamicString): trying to compute rank in position outside current string : " << i << ">" << current_size << endl;
			exit(0);

		}
	#endif

		if(unary_string)
			return i;

		vector<bool> code = codes.at(x);//bitvector to be searched in the wavelet tree
		return rank(&code, 0, 0, i);

	}